

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
graphics101::HalfEdgeTriMesh::boundary_vertices
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,HalfEdgeTriMesh *this)

{
  pointer pHVar1;
  ulong uVar2;
  pointer pHVar3;
  ulong uVar4;
  pointer pHVar5;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> result;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_78;
  vector<long,std::allocator<long>> *local_70;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pHVar5 = (this->m_halfedges).
           super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (this->m_halfedges).
           super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pHVar5 != pHVar1) {
    local_70 = (vector<long,std::allocator<long>> *)__return_storage_ptr__;
    do {
      if (pHVar5->face == -1) {
        local_78 = &local_68;
        std::
        _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                  ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,pHVar5,&local_78);
        uVar2 = (pHVar5->opposite_he).value;
        pHVar3 = (this->m_halfedges).
                 super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->m_halfedges).
                       super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3) *
                -0x3333333333333333;
        if (uVar4 < uVar2 || uVar4 - uVar2 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        local_78 = &local_68;
        std::
        _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                  ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,pHVar3 + uVar2,&local_78);
      }
      pHVar5 = pHVar5 + 1;
      __return_storage_ptr__ = (vector<long,_std::allocator<long>_> *)local_70;
    } while (pHVar5 != pHVar1);
  }
  std::vector<long,std::allocator<long>>::
  vector<std::__detail::_Node_iterator<long,true,false>,void>
            ((vector<long,std::allocator<long>> *)__return_storage_ptr__,
             (_Node_iterator<long,_true,_false>)local_68._M_before_begin._M_nxt,
             (_Node_iterator<long,_true,_false>)0x0,(allocator_type *)&local_78);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return (vector<long,_std::allocator<long>_> *)
         (vector<long,std::allocator<long>> *)__return_storage_ptr__;
}

Assistant:

std::vector< HalfEdgeTriMesh::Index > HalfEdgeTriMesh::boundary_vertices() const
{
    // Use an std::set<> if we wanted the returned sequence to be sorted.
    std::unordered_set< Index > result;
    for( const HalfEdge& he : m_halfedges )
    {
        if( -1 == he.face )
        {
            // result.extend( self.he_index2directed_edge( hei ) )
            result.insert( he.to_vertex );
            result.insert( halfedge( he.opposite_he ).to_vertex );
        }
    }

    return Indices( result.begin(), result.end() );
}